

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

bool __thiscall
wallet::SQLiteBatch::ExecStatement(SQLiteBatch *this,sqlite3_stmt *stmt,Span<const_std::byte> blob)

{
  long lVar1;
  Span<const_std::byte> blob_00;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  int iVar3;
  size_t in_RCX;
  ConstevalFormatString<2U> in_RDX;
  LogFlags in_RSI;
  void *__stat_loc;
  sqlite3_stmt *in_RDI;
  long in_FS_OFFSET;
  int res;
  Level in_stack_000000b0;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff28;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff68;
  sqlite3_stmt *stmt_00;
  int source_line;
  bool local_79;
  byte *in_stack_ffffffffffffffb0;
  char *pcVar4;
  size_t sVar5;
  char *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*(long *)(in_RDI + 8) + 200) == 0) {
    local_79 = false;
  }
  else {
    if (in_RSI == NONE) {
      __assert_fail("stmt",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
                    ,0x207,
                    "bool wallet::SQLiteBatch::ExecStatement(sqlite3_stmt *, Span<const std::byte>)"
                   );
    }
    __a = (allocator<char> *)&stack0xffffffffffffffb7;
    stmt_00 = in_RDI;
    pcVar4 = in_RDX.fmt;
    sVar5 = in_RCX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff58,(char *)in_RDI,__a)
    ;
    __stat_loc = (void *)0x1;
    blob_00.m_size = (size_t)in_RDX.fmt;
    blob_00.m_data = in_stack_ffffffffffffffb0;
    bVar2 = BindBlobToStatement(stmt_00,(int)((ulong)in_RSI >> 0x20),blob_00,
                                in_stack_ffffffffffffff68);
    source_line = (int)((ulong)stmt_00 >> 0x20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      if (((byte)in_RDI[0x40] & 1) == 0) {
        CSemaphore::wait((CSemaphore *)(*(long *)(in_RDI + 8) + 0x68),__stat_loc);
      }
      iVar3 = sqlite3_step(in_RSI);
      sqlite3_clear_bindings(in_RSI);
      sqlite3_reset(in_RSI);
      if (iVar3 != 0x65) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        in_stack_ffffffffffffff10 = "%s: Unable to execute statement: %s\n";
        sqlite3_errstr(iVar3);
        logging_function._M_str = in_stack_ffffffffffffffd8;
        logging_function._M_len = sVar5;
        source_file._M_str = pcVar4;
        source_file._M_len = in_RCX;
        LogPrintFormatInternal<char[14],char_const*>
                  (logging_function,source_file,source_line,in_RSI,in_stack_000000b0,in_RDX,
                   (char (*) [14])blob.m_data,(char **)blob.m_size);
      }
      if (((byte)in_RDI[0x40] & 1) == 0) {
        CSemaphore::post((CSemaphore *)in_stack_ffffffffffffff10);
      }
      local_79 = iVar3 == 0x65;
    }
    else {
      local_79 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_79;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::ExecStatement(sqlite3_stmt* stmt, Span<const std::byte> blob)
{
    if (!m_database.m_db) return false;
    assert(stmt);

    // Bind: leftmost parameter in statement is index 1
    if (!BindBlobToStatement(stmt, 1, blob, "key")) return false;

    // Acquire semaphore if not previously acquired when creating a transaction.
    if (!m_txn) m_database.m_write_semaphore.wait();

    // Execute
    int res = sqlite3_step(stmt);
    sqlite3_clear_bindings(stmt);
    sqlite3_reset(stmt);
    if (res != SQLITE_DONE) {
        LogPrintf("%s: Unable to execute statement: %s\n", __func__, sqlite3_errstr(res));
    }

    if (!m_txn) m_database.m_write_semaphore.post();

    return res == SQLITE_DONE;
}